

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_stuff.cpp
# Opt level: O0

bool CheatAddKey(cheatseq_t *cheat,BYTE key,bool *eat)

{
  byte bVar1;
  bool bVar2;
  bool *eat_local;
  BYTE key_local;
  cheatseq_t *cheat_local;
  
  if (cheat->Pos == (BYTE *)0x0) {
    cheat->Pos = cheat->Sequence;
    cheat->CurrentArg = '\0';
  }
  if (*cheat->Pos == '\0') {
    *eat = true;
    bVar1 = cheat->CurrentArg;
    cheat->CurrentArg = bVar1 + 1;
    cheat->Args[bVar1] = key;
    cheat->Pos = cheat->Pos + 1;
  }
  else if (key == *cheat->Pos) {
    cheat->Pos = cheat->Pos + 1;
  }
  else {
    cheat->Pos = cheat->Sequence;
    cheat->CurrentArg = '\0';
  }
  bVar2 = *cheat->Pos == 0xff;
  if (bVar2) {
    cheat->Pos = cheat->Sequence;
    cheat->CurrentArg = '\0';
  }
  return bVar2;
}

Assistant:

static bool CheatAddKey (cheatseq_t *cheat, BYTE key, bool *eat)
{
	if (cheat->Pos == NULL)
	{
		cheat->Pos = cheat->Sequence;
		cheat->CurrentArg = 0;
	}
	if (*cheat->Pos == 0)
	{
		*eat = true;
		cheat->Args[cheat->CurrentArg++] = key;
		cheat->Pos++;
	}
	else if (key == *cheat->Pos)
	{
		cheat->Pos++;
	}
	else
	{
		cheat->Pos = cheat->Sequence;
		cheat->CurrentArg = 0;
	}
	if (*cheat->Pos == 0xff)
	{
		cheat->Pos = cheat->Sequence;
		cheat->CurrentArg = 0;
		return true;
	}
	return false;
}